

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void pputrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  long lVar1;
  uint __fd;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  int extraout_EDX;
  ulong uVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  uchar c;
  uchar local_45;
  uint local_44;
  ulong local_40;
  long local_38;
  
  puVar7 = (uchar *)0x180;
  local_44 = sx;
  __fd = creat(fn,0x180);
  if ((int)__fd < 1) {
LAB_00103094:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)__fd;
    sVar3 = write(__fd,hd,0x20);
    puVar7 = hd;
    if (sVar3 == 0x20) {
      if (0 < sy) {
        uVar4 = (ulong)(uint)sy;
        uVar5 = (ulong)local_44;
        local_38 = (long)r << 2;
        uVar12 = 0;
        local_40 = uVar4;
        do {
          if (0 < (int)local_44) {
            uVar11 = 0;
            do {
              local_45 = (uchar)(int)bf[uVar11];
              fn = (char *)(ulong)__fd;
              puVar7 = &local_45;
              sVar3 = write(__fd,&local_45,1);
              sx = (int)uVar4;
              if (sVar3 != 1) {
                pputrast_cold_3();
                goto LAB_00103094;
              }
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
          }
          uVar12 = uVar12 + 1;
          bf = (float *)((long)bf + local_38);
        } while (uVar12 != local_40);
      }
      close(__fd);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < sx) {
    iVar2 = 0;
    iVar8 = extraout_EDX;
    iVar9 = sx;
    do {
      do {
        iVar6 = (int)puVar7;
        *(undefined8 *)(*(long *)((long)fn + 0x158) + (long)(*(int *)fn * iVar6 + iVar8) * 8) =
             extraout_XMM0_Qa;
        lVar1 = *(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4);
        lVar10 = (long)(*(int *)fn * iVar6 + iVar8) * 0x30;
        *(float *)(lVar1 + 0x24 + lVar10) = (float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
        *(float *)(lVar1 + 0x28 + lVar10) = (float)(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
        iVar8 = iVar8 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      iVar2 = iVar2 + 1;
      puVar7 = (uchar *)(ulong)(iVar6 + 1);
      iVar8 = extraout_EDX;
      iVar9 = sx;
    } while (iVar2 != sx);
  }
  return;
}

Assistant:

void pputrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = creat(fn,0600)) > 0) { ;
    if (write(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          c = (unsigned char)bf[r*i + j] ;
          if (write(fd,&c,sizeof(c)) != 1) {
            error(7) ;
          }
        }
      }
    }
    else {
      error(8) ;
    }
  }
  else {
    error(9) ;
  }
  close(fd) ;
}